

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O1

bool __thiscall uv::TCPClient::SetKeepAlive(TCPClient *this,int enable,uint delay)

{
  char *__s;
  long lVar1;
  pointer pcVar2;
  int errcode;
  uint uVar3;
  int iVar4;
  ILog4zManager *pIVar5;
  undefined4 in_register_00000014;
  uint uVar6;
  int iVar7;
  undefined4 in_register_00000034;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  long *in_FS_OFFSET;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  errcode = uv_tcp_keepalive(this->client_handle_,CONCAT44(in_register_00000034,enable),
                             CONCAT44(in_register_00000014,delay));
  if (errcode == 0) goto LAB_00118f5f;
  GetUVError_abi_cxx11_(&local_50,errcode);
  std::__cxx11::string::operator=((string *)&this->errmsg_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar1 = *in_FS_OFFSET;
  __s = (char *)(lVar1 + -0x800);
  pcVar2 = (this->errmsg_)._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (this->errmsg_)._M_string_length);
  uVar6 = 0;
  uVar3 = snprintf(__s,0x800,"%s",local_70[0]);
  if ((int)uVar3 < 0) {
    *__s = '\0';
  }
  else {
    uVar6 = uVar3;
    if (0x7ff < (int)uVar3) {
      *(undefined1 *)(lVar1 + -1) = 0;
      uVar6 = 0x800;
    }
  }
  uVar9 = (ulong)uVar6;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (uVar6 < 0x800) {
    pcVar10 = __s + uVar9;
    iVar7 = 0;
    iVar4 = snprintf(pcVar10,0x800 - uVar9,"%s"," ( ");
    if (iVar4 < 0) {
LAB_00118e52:
      *pcVar10 = '\0';
      iVar4 = iVar7;
    }
    else {
      iVar7 = (int)(0x800 - uVar9);
      if (iVar7 <= iVar4) {
        pcVar10 = (char *)(lVar1 + -1);
        goto LAB_00118e52;
      }
    }
    uVar9 = uVar9 + (long)iVar4;
  }
  if ((long)uVar9 < 0x800) {
    pcVar10 = __s + uVar9;
    iVar8 = 0x800 - (int)uVar9;
    iVar7 = snprintf(pcVar10,(long)iVar8,"%s"," ");
    iVar4 = 0;
    if (iVar7 < 0) {
LAB_00118ea4:
      *pcVar10 = '\0';
    }
    else {
      iVar4 = iVar7;
      if (iVar8 <= iVar7) {
        pcVar10 = (char *)(lVar1 + -1);
        iVar4 = iVar8;
        goto LAB_00118ea4;
      }
    }
    uVar9 = uVar9 + (long)iVar4;
  }
  if ((long)uVar9 < 0x800) {
    pcVar10 = __s + uVar9;
    iVar8 = 0x800 - (int)uVar9;
    iVar7 = snprintf(pcVar10,(long)iVar8,"%s"," ) : ");
    iVar4 = 0;
    if (iVar7 < 0) {
LAB_00118ef5:
      *pcVar10 = '\0';
    }
    else {
      iVar4 = iVar7;
      if (iVar8 <= iVar7) {
        pcVar10 = (char *)(lVar1 + -1);
        iVar4 = iVar8;
        goto LAB_00118ef5;
      }
    }
    uVar9 = uVar9 + (long)iVar4;
  }
  if ((long)uVar9 < 0x800) {
    pcVar10 = __s + uVar9;
    iVar7 = 0x800 - (int)uVar9;
    iVar4 = snprintf(pcVar10,(long)iVar7,"%d",0xa1);
    if (-1 < iVar4) {
      if (iVar4 < iVar7) goto LAB_00118f46;
      pcVar10 = (char *)(lVar1 + -1);
    }
    *pcVar10 = '\0';
  }
LAB_00118f46:
  pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,3,__s);
LAB_00118f5f:
  return errcode == 0;
}

Assistant:

bool TCPClient::SetKeepAlive(int enable, unsigned int delay)
{
    int iret = uv_tcp_keepalive(&client_handle_->tcphandle, enable , delay);
    if (iret) {
        errmsg_ = GetUVError(iret);
        LOGE(errmsg_);
        return false;
    }
    return true;
}